

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O3

QSize __thiscall QDockAreaLayoutInfo::size(QDockAreaLayoutInfo *this)

{
  bool bVar1;
  QSize QVar2;
  QSize QVar3;
  long lVar4;
  ulong uVar5;
  
  uVar5 = 0xffffffffffffffff;
  lVar4 = 0;
  do {
    uVar5 = uVar5 + 1;
    if ((ulong)(this->item_list).d.size <= uVar5) {
      QVar2.wd.m_i = 0;
      QVar2.ht.m_i = 0;
      return QVar2;
    }
    bVar1 = QDockAreaLayoutItem::skip
                      ((QDockAreaLayoutItem *)((long)&((this->item_list).d.ptr)->widgetItem + lVar4)
                      );
    lVar4 = lVar4 + 0x28;
  } while (bVar1);
  QVar3.wd.m_i = ((this->rect).x2.m_i - (this->rect).x1.m_i) + 1;
  QVar3.ht.m_i = ((this->rect).y2.m_i - (this->rect).y1.m_i) + 1;
  return QVar3;
}

Assistant:

QSize QDockAreaLayoutInfo::size() const
{
    return isEmpty() ? QSize(0, 0) : rect.size();
}